

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lys_type * lyd_leaf_type(lyd_node_leaf_list *leaf)

{
  lys_node *plVar1;
  int iVar2;
  lys_type *type_00;
  lys_type *local_30;
  lys_type *type;
  
  if ((leaf == (lyd_node_leaf_list *)0x0) ||
     (plVar1 = leaf->schema, (plVar1->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)) {
LAB_001684ff:
    type_00 = (lys_type *)0x0;
  }
  else {
    type_00 = (lys_type *)&plVar1[1].ref;
    iVar2 = *(int *)&plVar1[1].ref;
    local_30 = type_00;
    do {
      if (iVar2 == 0xb) {
        if (((type_00->info).uni.has_ptr_type != 0) && (leaf->validity != '\0')) {
          ly_vlog(leaf->schema->module->ctx,LYE_SPEC,LY_VLOG_LYD,leaf,
                  "Unable to determine the type of value \"%s\" from union type \"%s\" prior to validation."
                  ,leaf->value_str,type_00->der->name);
          return (lys_type *)0x0;
        }
        iVar2 = resolve_union(leaf,type_00,0,0,&local_30);
        type_00 = local_30;
        if (iVar2 != 0) goto LAB_001684ff;
      }
      else if (iVar2 == 9) {
        local_30 = &((type_00->info).lref.target)->type;
        type_00 = local_30;
      }
      iVar2 = 9;
    } while (type_00->base == LY_TYPE_LEAFREF);
  }
  return type_00;
}

Assistant:

lys_type *
lyd_leaf_type(const struct lyd_node_leaf_list *leaf)
{
    struct lys_type *type;

    if (!leaf || !(leaf->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        return NULL;
    }

    type = &((struct lys_node_leaf *)leaf->schema)->type;

    do {
        if (type->base == LY_TYPE_LEAFREF) {
            type = &type->info.lref.target->type;
        } else if (type->base == LY_TYPE_UNION) {
            if (type->info.uni.has_ptr_type && leaf->validity) {
                /* we don't know what it will be after resolution (validation) */
                LOGVAL(leaf->schema->module->ctx, LYE_SPEC, LY_VLOG_LYD, leaf,
                       "Unable to determine the type of value \"%s\" from union type \"%s\" prior to validation.",
                       leaf->value_str, type->der->name);
                return NULL;
            }

            if (resolve_union((struct lyd_node_leaf_list *)leaf, type, 0, 0, &type)) {
                /* resolve union failed */
                return NULL;
            }
        }
    } while (type->base == LY_TYPE_LEAFREF);

    return type;
}